

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O2

Segment * __thiscall
mnf::Manifold::getView<1>(Segment *__return_storage_ptr__,Manifold *this,RefVec *val,size_t i)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  Index IVar3;
  Index size;
  
  iVar2 = (*this->_vptr_Manifold[7])(this);
  if (CONCAT44(extraout_var,iVar2) <= i) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1a4,"Segment mnf::Manifold::getView(RefVec, size_t) const [D = 1]");
  }
  lVar1 = *(long *)&(val->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8;
  IVar3 = tangentDim(this);
  if (lVar1 == IVar3) {
    IVar3 = getStart<1>(this,i);
    size = getDim<1>(this,i);
    Eigen::
    VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
    VectorBlock(__return_storage_ptr__,val,IVar3,size);
    return __return_storage_ptr__;
  }
  __assert_fail("val.size() == getDim<D>()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                ,0x1a5,"Segment mnf::Manifold::getView(RefVec, size_t) const [D = 1]");
}

Assistant:

inline Segment Manifold::getView(RefVec val, size_t i) const
{
  mnf_assert(i < numberOfSubManifolds() && "invalid index");
  mnf_assert(val.size() == getDim<D>());
  return val.segment(getStart<D>(i), getDim<D>(i));
}